

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::addCols(HighsSparseMatrix *this,HighsSparseMatrix *new_cols,int8_t *in_partition)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar18;
  size_type __n;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<int,_std::allocator<int>_> new_row_length;
  undefined1 local_68 [16];
  pointer local_58;
  HighsSparseMatrix *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  value_type_conflict2 local_34;
  int iVar17;
  long lVar22;
  
  uVar1 = new_cols->num_col_;
  uVar15 = (ulong)uVar1;
  uVar16 = uVar1;
  if (new_cols->format_ != kColwise) {
    uVar16 = new_cols->num_row_;
  }
  if (uVar15 != 0) {
    uVar16 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar16];
    uVar14 = (ulong)uVar16;
    iVar2 = this->num_col_;
    lVar13 = (long)iVar2;
    iVar20 = this->num_row_;
    __n = (size_type)iVar20;
    iVar18 = iVar20;
    if (this->format_ == kColwise) {
      iVar18 = iVar2;
    }
    iVar18 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar18];
    if ((this->format_ == kRowwise) && (iVar18 < (int)uVar16)) {
      ensureColwise(this);
    }
    this_00 = &this->start_;
    iVar10 = iVar18 + uVar16;
    if (this->format_ == kColwise) {
      std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)(iVar2 + uVar1 + 1));
      auVar9 = _DAT_003c57d0;
      if (uVar16 == 0) {
        if (0 < (int)uVar1) {
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar12 = uVar15 - 1;
          auVar19._8_4_ = (int)lVar12;
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
          lVar12 = 0;
          auVar19 = auVar19 ^ _DAT_003c57d0;
          auVar21 = _DAT_003c57b0;
          auVar23 = _DAT_003c57c0;
          do {
            auVar24 = auVar23 ^ auVar9;
            iVar20 = auVar19._4_4_;
            if ((bool)(~(auVar24._4_4_ == iVar20 && auVar19._0_4_ < auVar24._0_4_ ||
                        iVar20 < auVar24._4_4_) & 1)) {
              *(int *)((long)piVar3 + lVar12 + lVar13 * 4) = iVar18;
            }
            if ((auVar24._12_4_ != auVar19._12_4_ || auVar24._8_4_ <= auVar19._8_4_) &&
                auVar24._12_4_ <= auVar19._12_4_) {
              *(int *)((long)piVar3 + lVar12 + lVar13 * 4 + 4) = iVar18;
            }
            auVar24 = auVar21 ^ auVar9;
            iVar17 = auVar24._4_4_;
            if (iVar17 <= iVar20 && (iVar17 != iVar20 || auVar24._0_4_ <= auVar19._0_4_)) {
              *(int *)((long)piVar3 + lVar12 + lVar13 * 4 + 8) = iVar18;
              *(int *)((long)piVar3 + lVar12 + lVar13 * 4 + 0xc) = iVar18;
            }
            lVar22 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar22 + 4;
            lVar22 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 4;
            auVar21._8_8_ = lVar22 + 4;
            lVar12 = lVar12 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar12);
        }
      }
      else if (0 < (int)uVar1) {
        piVar3 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0;
        do {
          piVar4[lVar13 + uVar11] = piVar3[uVar11] + iVar18;
          uVar11 = uVar11 + 1;
        } while (uVar15 != uVar11);
      }
      (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)(iVar2 + uVar1)] = iVar10;
      this->num_col_ = this->num_col_ + uVar1;
      if (0 < (int)uVar16) {
        std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar10);
        std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar10);
        piVar3 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = 0;
        do {
          piVar4[(long)iVar18 + uVar15] = piVar3[uVar15];
          pdVar7[(long)iVar18 + uVar15] = pdVar6[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
    }
    else {
      if (uVar16 != 0) {
        this_01 = &this->index_;
        local_40 = this_00;
        std::vector<int,_std::allocator<int>_>::resize(this_01,(long)iVar10);
        this_02 = &this->value_;
        std::vector<double,_std::allocator<double>_>::resize(this_02,(long)iVar10);
        local_68 = (undefined1  [16])0x0;
        local_58 = (pointer)0x0;
        local_34 = 0;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  ((vector<int,_std::allocator<int>_> *)local_68,__n,&local_34);
        if (0 < (int)uVar16) {
          piVar3 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            *(int *)(local_68._0_8_ + (long)piVar3[uVar11] * 4) =
                 *(int *)(local_68._0_8_ + (long)piVar3[uVar11] * 4) + 1;
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
        piVar3 = (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar18 = piVar3[__n];
        piVar3[__n] = iVar10;
        if (0 < iVar20) {
          piVar4 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar20 = *(int *)(local_68._0_8_ + (__n - 1) * 4);
            iVar17 = (int)uVar14;
            uVar16 = iVar17 - iVar20;
            uVar14 = (ulong)uVar16;
            iVar10 = piVar3[__n - 1];
            *(uint *)(local_68._0_8_ + (__n - 1) * 4) = uVar16 + iVar18;
            if (iVar10 < iVar18) {
              lVar13 = (long)iVar18;
              do {
                piVar4[((long)iVar17 + lVar13 + -1) - (long)iVar20] = piVar4[lVar13 + -1];
                pdVar6[((long)iVar17 + lVar13 + -1) - (long)iVar20] = pdVar6[lVar13 + -1];
                lVar13 = lVar13 + -1;
              } while (iVar10 < lVar13);
            }
            piVar3[__n - 1] = uVar16 + iVar10;
            bVar8 = 1 < (long)__n;
            __n = __n - 1;
            iVar18 = iVar10;
          } while (bVar8);
        }
        if (0 < (int)uVar1) {
          piVar3 = (new_cols->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (this_02->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar14 = 0;
          do {
            lVar13 = (long)piVar3[uVar14];
            uVar11 = uVar14 + 1;
            if (piVar3[uVar14] < piVar3[uVar14 + 1]) {
              piVar5 = (new_cols->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7 = (new_cols->value_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                iVar20 = piVar5[lVar13];
                piVar4[*(int *)(local_68._0_8_ + (long)iVar20 * 4)] = (int)uVar14 + iVar2;
                iVar18 = *(int *)(local_68._0_8_ + (long)iVar20 * 4);
                pdVar6[iVar18] = pdVar7[lVar13];
                *(int *)(local_68._0_8_ + (long)iVar20 * 4) = iVar18 + 1;
                lVar13 = lVar13 + 1;
              } while (lVar13 < piVar3[uVar11]);
            }
            uVar14 = uVar11;
          } while (uVar11 != uVar15);
        }
        if ((pointer)local_68._0_8_ != (pointer)0x0) {
          local_48 = this;
          operator_delete((void *)local_68._0_8_);
          this = local_48;
        }
      }
      this->num_col_ = this->num_col_ + uVar1;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::addCols(const HighsSparseMatrix new_cols,
                                const int8_t* in_partition) {
  assert(new_cols.isColwise());
  const HighsInt num_new_col = new_cols.num_col_;
  const HighsInt num_new_nz = new_cols.numNz();
  const vector<HighsInt>& new_matrix_start = new_cols.start_;
  const vector<HighsInt>& new_matrix_index = new_cols.index_;
  const vector<double>& new_matrix_value = new_cols.value_;

  assert(this->formatOk());
  // Adding columns to a row-wise partitioned matrix needs the
  // partition information
  const bool partitioned = this->format_ == MatrixFormat::kRowwisePartitioned;
  // Cannot handle the row-wise partitioned case
  assert(!partitioned);
  if (partitioned) {
    //    if (in_partition == NULL) { printf("in_partition == NULL\n"); }
    assert(in_partition != NULL);
  }
  assert(num_new_col >= 0);
  assert(num_new_nz >= 0);
  if (num_new_col == 0) {
    // No columns are being added, so check that no nonzeros are being
    // added
    assert(num_new_nz == 0);
    return;
  }
  // Adding a positive number of columns to a matrix
  if (num_new_nz) {
    // Nonzeros are being added, so ensure that non-null data are
    // being passed
    assert(!new_matrix_start.empty());
    assert(!new_matrix_index.empty());
    assert(!new_matrix_value.empty());
  }
  HighsInt num_col = this->num_col_;
  HighsInt num_row = this->num_row_;
  HighsInt num_nz = this->numNz();
  // Check that nonzeros aren't being appended to a matrix with no rows
  assert(num_new_nz <= 0 || num_row > 0);

  // If matrix is currently a standard row-wise matrix and there are
  // more new nonzeros than current nonzeros so flip column-wise
  if (this->format_ == MatrixFormat::kRowwise && num_new_nz > num_nz)
    this->ensureColwise();

  // Determine the new number of columns and nonzeros in the matrix
  HighsInt new_num_col = num_col + num_new_col;
  HighsInt new_num_nz = num_nz + num_new_nz;

  if (this->isColwise()) {
    // Matrix is column-wise
    this->start_.resize(new_num_col + 1);
    // Append the starts of the new columns
    if (num_new_nz) {
      // Nontrivial number of nonzeros being added, so use new_matrix_start
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz + new_matrix_start[iNewCol];
    } else {
      // No nonzeros being added, so new_matrix_start may be null, but entries
      // of zero are implied.
      for (HighsInt iNewCol = 0; iNewCol < num_new_col; iNewCol++)
        this->start_[num_col + iNewCol] = num_nz;
    }
    this->start_[num_col + num_new_col] = new_num_nz;
    // Update the number of columns
    this->num_col_ += num_new_col;
    // If no nonzeros are being added then there's nothing else to do
    if (num_new_nz <= 0) return;
    // Adding a non-trivial matrix: resize the column-wise matrix arrays
    // accordingly
    this->index_.resize(new_num_nz);
    this->value_.resize(new_num_nz);
    // Copy in the new indices and values
    for (HighsInt iEl = 0; iEl < num_new_nz; iEl++) {
      this->index_[num_nz + iEl] = new_matrix_index[iEl];
      this->value_[num_nz + iEl] = new_matrix_value[iEl];
    }
  } else {
    // Matrix is row-wise
    if (num_new_nz) {
      // Adding a positive number of nonzeros
      this->index_.resize(new_num_nz);
      this->value_.resize(new_num_nz);
      // Determine the row lengths of the new columns being added
      std::vector<HighsInt> new_row_length;
      new_row_length.assign(num_row, 0);
      for (HighsInt iEl = 0; iEl < num_new_nz; iEl++)
        new_row_length[new_matrix_index[iEl]]++;
      // Now shift the indices and values to make space
      HighsInt entry_offset = num_new_nz;
      HighsInt to_original_el = this->start_[num_row];
      this->start_[num_row] = new_num_nz;
      for (HighsInt iRow = num_row - 1; iRow >= 0; iRow--) {
        entry_offset -= new_row_length[iRow];
        HighsInt from_original_el = this->start_[iRow];
        // Can now use this new_row_length to store the start for the
        // new entries
        new_row_length[iRow] = to_original_el + entry_offset;
        for (HighsInt iEl = to_original_el - 1; iEl >= from_original_el;
             iEl--) {
          this->index_[iEl + entry_offset] = this->index_[iEl];
          this->value_[iEl + entry_offset] = this->value_[iEl];
        }
        to_original_el = from_original_el;
        this->start_[iRow] = entry_offset + from_original_el;
      }
      // Now insert the indices and values for the new columns
      for (HighsInt iCol = 0; iCol < num_new_col; iCol++) {
        for (HighsInt iEl = new_matrix_start[iCol];
             iEl < new_matrix_start[iCol + 1]; iEl++) {
          HighsInt iRow = new_matrix_index[iEl];
          this->index_[new_row_length[iRow]] = num_col + iCol;
          this->value_[new_row_length[iRow]] = new_matrix_value[iEl];
          new_row_length[iRow]++;
        }
      }
    }
    // Have to increase the number of columns, even if no nonzeros are being
    // added
    this->num_col_ += num_new_col;
  }
}